

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
          (DelayedCloseWebSocket *this,WebSocket *other)

{
  bool bVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  undefined8 *puVar2;
  Coroutine<void> *this_00;
  WebSocket *pWVar3;
  Promise<void> *promise;
  Promise<void> *pPVar4;
  PromiseAwaiter<void> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  DelayedCloseWebSocket *this_01;
  undefined8 in_RDX;
  void *pvVar5;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  WebSocket *other_local;
  DelayedCloseWebSocket *this_local;
  
  puVar2 = (undefined8 *)operator_new(0x5f0);
  *puVar2 = pumpTo;
  puVar2[1] = pumpTo;
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar2 + 0x47);
  pPVar4 = (Promise<void> *)(puVar2 + 0xba);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)(puVar2 + 0x7e);
  this_01 = (DelayedCloseWebSocket *)(puVar2 + 0xbb);
  this_00 = (Coroutine<void> *)(puVar2 + 2);
  puVar2[0xbc] = other;
  puVar2[0xb8] = in_RDX;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar2 + 0xb5),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"pumpTo",0x1b40,0x17);
  pvVar5 = (void *)puVar2[0xb7];
  kj::_::Coroutine<void>::Coroutine(this_00,*(SourceLocation *)(puVar2 + 0xb5));
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar1 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar2 + 0x5ed));
  if (bVar1) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar2 + 0x5ed));
    pWVar3 = Own<kj::WebSocket,_std::nullptr_t>::operator->
                       ((Own<kj::WebSocket,_std::nullptr_t> *)(puVar2[0xbc] + 8));
    (*pWVar3->_vptr_WebSocket[7])(pPVar4,pWVar3,puVar2[0xb8]);
    promise = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>(this_00,pPVar4);
    co_await<void>(__return_storage_ptr__,promise);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar1) {
      *(undefined1 *)((long)puVar2 + 0x5ec) = 1;
      _GLOBAL__N_1::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
                ((void *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),pvVar5);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Promise<void>::~Promise(pPVar4);
    afterReceiveClosed(this_01);
    pPVar4 = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>
                       (this_00,(Promise<void> *)this_01);
    co_await<void>(__return_storage_ptr___00,pPVar4);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr___00);
    if (!bVar1) {
      *(undefined1 *)((long)puVar2 + 0x5ec) = 2;
      _GLOBAL__N_1::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
                ((void *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),pvVar5);
      if ((extraout_AL_00 & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
    Promise<void>::~Promise((Promise<void> *)this_01);
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar1 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x5ee));
    if (bVar1) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x5ee));
      kj::_::Coroutine<void>::~Coroutine(this_00);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x5f0);
      }
    }
    else {
      *puVar2 = 0;
      *(undefined1 *)((long)puVar2 + 0x5ec) = 3;
      _GLOBAL__N_1::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
                ((void *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),pvVar5);
    }
  }
  else {
    *(undefined1 *)((long)puVar2 + 0x5ec) = 0;
    _GLOBAL__N_1::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
              ((void *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),pvVar5);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
      co_await inner->pumpTo(other);
      co_await afterReceiveClosed();
    }